

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O2

shared_ptr<ear::PointSourcePanner> __thiscall ear::configurePolarPanner(ear *this,Layout *layout)

{
  __type _Var1;
  internal_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Bit_iterator _Var2;
  shared_ptr<ear::PointSourcePanner> sVar3;
  allocator<char> local_91;
  string local_90;
  vector<bool,_std::allocator<bool>_> isLfe;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  Layout::isLfe(&isLfe,layout);
  local_90._M_dataplus._M_p._0_1_ = 1;
  _Var2 = std::__find_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                    (isLfe.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                     isLfe.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p,
                     isLfe.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
  if ((_Var2.super__Bit_iterator_base._M_p ==
       isLfe.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
       super__Bit_iterator_base._M_p) &&
     (_Var2.super__Bit_iterator_base._M_offset ==
      isLfe.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_offset)) {
    checkScreenSpeakers(layout);
    Layout::name_abi_cxx11_(&local_90,layout);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"0+2+0",&local_91);
    _Var1 = std::operator==(&local_90,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_90);
    if (_Var1) {
      configureStereoPolarPanner(this,layout);
    }
    else {
      configureFullPolarPanner(this,layout);
    }
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&isLfe.super__Bvector_base<std::allocator<bool>_>);
    sVar3.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar3.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<ear::PointSourcePanner>)
           sVar3.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (internal_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"lfe channel passed to point source panner",
             (allocator<char> *)&local_48);
  internal_error::internal_error(this_00,&local_90);
  __cxa_throw(this_00,&internal_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<PointSourcePanner> configurePolarPanner(
      const Layout& layout) {
    auto isLfe = layout.isLfe();
    if (find(isLfe.begin(), isLfe.end(), true) != isLfe.end()) {
      throw internal_error("lfe channel passed to point source panner");
    }

    checkScreenSpeakers(layout);

    if (layout.name() == std::string("0+2+0")) {
      return configureStereoPolarPanner(layout);
    } else {
      return configureFullPolarPanner(layout);
    }
  }